

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O0

string * __thiscall
cmDirectoryWatcher::Path_abi_cxx11_(string *__return_storage_ptr__,cmDirectoryWatcher *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmDirectoryWatcher *local_18;
  cmDirectoryWatcher *this_local;
  
  local_18 = this;
  this_local = (cmDirectoryWatcher *)__return_storage_ptr__;
  (*(((this->super_cmRealDirectoryWatcher).Parent)->super_cmIBaseWatcher)._vptr_cmIBaseWatcher[3])()
  ;
  std::operator+(&local_38,&local_58,&(this->super_cmRealDirectoryWatcher).PathSegment);
  std::operator+(__return_storage_ptr__,&local_38,"/");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string Path() const final
  {
    return this->Parent->Path() + this->PathSegment + "/";
  }